

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O2

int kvtree_close_with_unlock(char *file,int fd)

{
  int iVar1;
  
  iVar1 = kvtree_file_unlock(file,fd);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = kvtree_close(file,fd);
  return iVar1;
}

Assistant:

int kvtree_close_with_unlock(const char* file, int fd)
{
  /* release the file lock */
  int ret = kvtree_file_unlock(file, fd);
  if (ret != KVTREE_SUCCESS) {
    return ret;
  }

  /* close the file */
  return kvtree_close(file, fd);
}